

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdUpdateTxInScriptSig
              (void *handle,void *create_handle,char *txid,uint32_t vout,char *script_sig)

{
  pointer *ppuVar1;
  ConfidentialTransaction *this;
  _func_int *p_Var2;
  bool bVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  TransactionContext *tx;
  Script script;
  Txid txid_obj;
  bool is_bitcoin;
  allocator local_e1;
  Script local_e0;
  Txid local_a8;
  string local_88;
  Script local_68;
  
  cfd::Initialize();
  ppuVar1 = &local_e0.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_e0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&local_e0);
  if (local_e0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_e0._vptr_Script);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_e0._vptr_Script = (_func_int **)0x5e44da;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2ec;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdUpdateTxInScriptSig";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e0,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e0._vptr_Script = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_e0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_e0,txid,(allocator *)&local_68);
  cfd::core::Txid::Txid(&local_a8,(string *)&local_e0);
  if (local_e0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_e0._vptr_Script);
  }
  cfd::core::Script::Script(&local_e0);
  bVar3 = cfd::capi::IsEmptyString(script_sig);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&local_88,script_sig,&local_e1);
    cfd::core::Script::Script(&local_68,&local_88);
    cfd::core::Script::operator=(&local_e0,&local_68);
    cfd::core::Script::~Script(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p));
    }
  }
  local_88._M_dataplus._M_p._0_1_ = '\0';
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),(bool *)&local_88);
  this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    p_Var2 = (this->super_AbstractTransaction)._vptr_AbstractTransaction[2];
    if ((char)local_88._M_dataplus._M_p == '\x01') {
      uVar4 = (*p_Var2)(this,&local_a8,(ulong)vout);
      cfd::core::Transaction::SetUnlockingScript((Transaction *)this,uVar4,&local_e0);
    }
    else {
      uVar4 = (*p_Var2)(this,&local_a8,(ulong)vout);
      cfd::core::ConfidentialTransaction::SetUnlockingScript(this,uVar4,&local_e0);
    }
    cfd::core::Script::~Script(&local_e0);
    local_a8._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._vptr_Script =
       (_func_int **)
       &local_68.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_68);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUpdateTxInScriptSig(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    const char* script_sig) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    Script script;
    if (!IsEmptyString(script_sig)) script = Script(script_sig);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetUnlockingScript(index, script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetUnlockingScript(index, script);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}